

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

size_t mspace_footprint_limit(mspace msp)

{
  size_t local_30;
  size_t maf;
  mstate ms;
  size_t result;
  mspace msp_local;
  
  local_30 = *(size_t *)((long)msp + 0x368);
  if (local_30 == 0) {
    local_30 = 0xffffffffffffffff;
  }
  return local_30;
}

Assistant:

size_t mspace_footprint_limit(mspace msp) {
  size_t result = 0;
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    size_t maf = ms->footprint_limit;
    result = (maf == 0) ? MAX_SIZE_T : maf;
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return result;
}